

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O2

bool __thiscall QNetworkCookieJar::deleteCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  QNetworkCookie *pQVar4;
  long lVar5;
  const_iterator cVar6;
  QNetworkCookie *this_00;
  
  lVar1 = *(long *)(this + 8);
  this_00 = *(QNetworkCookie **)(lVar1 + 0x80);
  lVar3 = *(long *)(lVar1 + 0x88);
  pQVar4 = this_00 + lVar3;
  lVar5 = lVar3 << 3;
  for (lVar3 = lVar3 >> 2; cVar6.i = this_00, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = QNetworkCookie::hasSameIdentifier(this_00,cookie);
    if (bVar2) goto LAB_0018379a;
    bVar2 = QNetworkCookie::hasSameIdentifier(this_00 + 1,cookie);
    cVar6.i = this_00 + 1;
    if (bVar2) goto LAB_0018379a;
    bVar2 = QNetworkCookie::hasSameIdentifier(this_00 + 2,cookie);
    cVar6.i = this_00 + 2;
    if (bVar2) goto LAB_0018379a;
    bVar2 = QNetworkCookie::hasSameIdentifier(this_00 + 3,cookie);
    cVar6.i = this_00 + 3;
    if (bVar2) goto LAB_0018379a;
    this_00 = this_00 + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      cVar6.i = pQVar4;
      if ((lVar5 != 3) ||
         (bVar2 = QNetworkCookie::hasSameIdentifier(this_00,cookie), cVar6.i = this_00, bVar2))
      goto LAB_0018379a;
      cVar6.i = this_00 + 1;
    }
    bVar2 = QNetworkCookie::hasSameIdentifier(cVar6.i,cookie);
    if (bVar2) goto LAB_0018379a;
    this_00 = cVar6.i + 1;
  }
  bVar2 = QNetworkCookie::hasSameIdentifier(this_00,cookie);
  cVar6.i = pQVar4;
  if (bVar2) {
    cVar6.i = this_00;
  }
LAB_0018379a:
  pQVar4 = (QNetworkCookie *)(*(long *)(lVar1 + 0x88) * 8 + *(long *)(lVar1 + 0x80));
  if (cVar6.i != pQVar4) {
    QList<QNetworkCookie>::erase((QList<QNetworkCookie> *)(lVar1 + 0x78),cVar6);
  }
  return cVar6.i != pQVar4;
}

Assistant:

bool QNetworkCookieJar::deleteCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const auto it = std::find_if(d->allCookies.cbegin(), d->allCookies.cend(),
                                 [&cookie](const auto &c) { return c.hasSameIdentifier(cookie); });
    if (it != d->allCookies.cend()) {
        d->allCookies.erase(it);
        return true;
    }
    return false;
}